

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall Rml::Context::~Context(Context *this)

{
  Element *pEVar1;
  pointer ppEVar2;
  pointer pcVar3;
  ScrollController *pSVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__Context_00334010;
  PluginRegistry::NotifyContextDestroy(this);
  UnloadAllDocuments(this);
  ReleaseUnloadedDocuments(this);
  pEVar1 = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = (Element *)0x0;
  if (pEVar1 != (Element *)0x0) {
    (**(code **)((long)(pEVar1->super_ScriptInterface).super_Releasable + 0x10))();
  }
  pEVar1 = (this->cursor_proxy)._M_t.
           super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  (this->cursor_proxy)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = (Element *)0x0;
  if (pEVar1 != (Element *)0x0) {
    (**(code **)((long)(pEVar1->super_ScriptInterface).super_Releasable + 0x10))();
  }
  this->instancer = (ContextInstancer *)0x0;
  ::std::unique_ptr<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>::~unique_ptr
            (&this->default_data_type_register);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::destroy(&this->data_models);
  ppEVar2 = (this->drag_hover_chain).m_container.
            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)(this->drag_hover_chain).m_container.
                                  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar2
                   );
  }
  pEVar1 = (this->cursor_proxy)._M_t.
           super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  if (pEVar1 != (Element *)0x0) {
    (**(code **)((long)(pEVar1->super_ScriptInterface).super_Releasable + 0x10))();
  }
  (this->cursor_proxy)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = (Element *)0x0;
  pcVar3 = (this->cursor_name)._M_dataplus._M_p;
  paVar5 = &(this->cursor_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar5) {
    operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
  }
  pSVar4 = (this->scroll_controller)._M_t.
           super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
           ._M_t.
           super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
           .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl;
  if (pSVar4 != (ScrollController *)0x0) {
    operator_delete(pSVar4,0x40);
  }
  (this->scroll_controller)._M_t.
  super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>._M_t.
  super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>.
  super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl = (ScrollController *)0x0;
  pEVar1 = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  if (pEVar1 != (Element *)0x0) {
    (**(code **)((long)(pEVar1->super_ScriptInterface).super_Releasable + 0x10))();
  }
  (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = (Element *)0x0;
  ::std::
  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ::~vector(&this->unloaded_documents);
  ppEVar2 = (this->document_focus_history).
            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)(this->document_focus_history).
                                  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar2
                   );
  }
  ppEVar2 = (this->active_chain).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)(this->active_chain).
                                  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar2
                   );
  }
  ppEVar2 = (this->hover_chain).m_container.
            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)(this->hover_chain).m_container.
                                  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar2
                   );
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->active_themes);
  pcVar3 = (this->documents_base_tag)._M_dataplus._M_p;
  paVar5 = &(this->documents_base_tag).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar5) {
    operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->name)._M_dataplus._M_p;
  paVar5 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar5) {
    operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Context::~Context()
{
	PluginRegistry::NotifyContextDestroy(this);

	UnloadAllDocuments();

	ReleaseUnloadedDocuments();

	root.reset();

	cursor_proxy.reset();

	instancer = nullptr;
}